

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_type.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseType
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  Capabilities *__args_1;
  bool bVar1;
  Token *pTVar2;
  Position *pPVar3;
  type pEVar4;
  pointer this_00;
  Expr *pEVar5;
  TokenExpr *this_01;
  Token **in_RDX;
  undefined1 local_c8 [24];
  Position local_b0;
  undefined1 local_98 [24];
  _Head_base<0UL,_pfederc::Expr_*,_false> local_80;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Position pos;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Parser *this_local;
  
  pTVar2 = Lexer::getCurrentToken
                     ((Lexer *)(caps->_M_t).
                               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
  pPVar3 = Token::getPosition(pTVar2);
  Position::Position((Position *)&expr,pPVar3);
  sanityExpect((Parser *)caps,TOK_KW_TYPE);
  parseExpression((Parser *)local_40,(Precedence)caps);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
  if (bVar1) {
    pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40);
    bVar1 = isBiOpExpr(pEVar4,TOK_OP_NONE);
    if (bVar1) {
      pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40
                         );
      local_80._M_head_impl = (Expr *)__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
      if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_80._M_head_impl ==
          (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
        __cxa_bad_cast();
      }
      pEVar5 = BiOpExpr::getRight((BiOpExpr *)local_80._M_head_impl);
      bVar1 = isTokenExpr(pEVar5,TOK_ID);
      if (bVar1) {
        pPVar3 = Expr::getPosition(local_80._M_head_impl);
        Position::operator+(&local_b0,(Position *)&expr,pPVar3);
        expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             local_b0.line;
        __args_1 = (caps->_M_t).
                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
        pEVar5 = BiOpExpr::getRight(local_80._M_head_impl);
        this_01 = (TokenExpr *)__dynamic_cast(pEVar5,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (this_01 == (TokenExpr *)0x0) {
          __cxa_bad_cast();
        }
        local_c8._8_8_ = TokenExpr::getTokenPtr(this_01);
        BiOpExpr::getLeftPtr((BiOpExpr *)local_c8);
        std::
        make_unique<pfederc::TypeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)(local_c8 + 0x10),(Position *)__args_1,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )&expr,in_RDX,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_c8 + 8))
        ;
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::TypeExpr,std::default_delete<pfederc::TypeExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_> *)
                   (local_c8 + 0x10));
        std::unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_> *)
                   (local_c8 + 0x10));
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_c8);
      }
      else {
        local_98._6_2_ = 2;
        local_98._0_4_ = 8;
        pEVar5 = BiOpExpr::getRight(local_80._M_head_impl);
        Expr::getPosition(pEVar5);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_98 + 8),(SyntaxErrorCode *)(local_98 + 6),(Position *)local_98);
        generateError((Parser *)(local_98 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)caps);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_98 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_98 + 8));
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
    }
    else {
      biopexpr._6_2_ = 2;
      biopexpr._0_4_ = 0x1f;
      this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                          ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_40);
      Expr::getPosition(this_00);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&local_70,(SyntaxErrorCode *)((long)&biopexpr + 6),(Position *)&biopexpr);
      generateError((Parser *)local_68,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_68);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr(&local_70);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
  }
  else {
    local_68._22_2_ = 2;
    local_68._16_4_ = 0x1f;
    pTVar2 = Lexer::getCurrentToken
                       ((Lexer *)(caps->_M_t).
                                 super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                 .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl
                       );
    Token::getPosition(pTVar2);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_68 + 0x18),(SyntaxErrorCode *)(local_68 + 0x16),
               (Position *)(local_68 + 0x10));
    generateError((Parser *)local_48,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)caps);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_48)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_68 + 0x18));
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
  }
  local_68._12_4_ = 1;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_40);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseType(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TYPE);

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_NONE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, expr->getPosition()));
    return nullptr;
  }

  BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);

  if (!isTokenExpr(biopexpr.getRight(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, biopexpr.getRight().getPosition()));
    return nullptr;
  }

  pos = pos + biopexpr.getPosition();

  return std::make_unique<TypeExpr>(lexer, pos, std::move(caps),
      dynamic_cast<const TokenExpr&>(biopexpr.getRight()).getTokenPtr(),
      biopexpr.getLeftPtr());
}